

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O3

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint *puVar15;
  short sVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint *puVar20;
  int iVar21;
  bool bVar22;
  
  sVar6 = 0xffffffffffffffb8;
  if (3 < hbSize) {
    uVar17 = *headerBuffer;
    uVar18 = uVar17 & 0xf;
    sVar6 = 0xffffffffffffffd4;
    if (uVar18 < 0xb) {
      *tableLogPtr = uVar18 + 5;
      iVar13 = 0x20 << (sbyte)uVar18;
      uVar3 = *maxSVPtr;
      iVar21 = iVar13 + 1;
      iVar19 = uVar18 + 6;
      uVar17 = uVar17 >> 4;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar15 = (uint *)((long)headerBuffer + (hbSize - 4));
      uVar18 = 4;
      bVar22 = true;
      uVar12 = 0;
      puVar8 = (uint *)headerBuffer;
      do {
        if (!bVar22) {
          sVar16 = (short)uVar17;
          uVar7 = uVar12;
          puVar20 = puVar8;
          while (sVar16 == -1) {
            if (puVar20 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar8 = (uint *)((long)puVar20 + 2);
              puVar20 = (uint *)((long)puVar20 + 2);
              uVar17 = *puVar8 >> ((byte)uVar18 & 0x1f);
            }
            else {
              uVar17 = uVar17 >> 0x10;
              uVar18 = uVar18 + 0x10;
            }
            uVar7 = (ulong)((int)uVar7 + 0x18);
            sVar16 = (short)uVar17;
          }
          while( true ) {
            uVar9 = uVar17 & 3;
            iVar5 = (int)uVar7;
            if (uVar9 != 3) break;
            uVar7 = (ulong)(iVar5 + 3);
            uVar17 = uVar17 >> 2;
            uVar18 = uVar18 + 2;
          }
          uVar10 = iVar5 + uVar9;
          if (uVar3 < uVar10) {
            return 0xffffffffffffffd0;
          }
          if ((uint)uVar12 < uVar10) {
            memset(normalizedCounter + uVar12,0,(ulong)(~(uint)uVar12 + iVar5 + uVar9) * 2 + 2);
            uVar12 = (ulong)uVar10;
          }
          uVar18 = uVar18 + 2;
          iVar5 = (int)uVar18 >> 3;
          puVar8 = (uint *)((long)puVar20 + (long)iVar5);
          if ((puVar2 < puVar20) && (puVar15 < puVar8)) {
            uVar17 = uVar17 >> 2;
            puVar8 = puVar20;
          }
          else {
            uVar18 = uVar18 & 7;
            uVar17 = *(uint *)((long)puVar20 + (long)iVar5) >> (sbyte)uVar18;
          }
        }
        uVar9 = iVar13 * 2 - 1;
        uVar10 = uVar9 - iVar21;
        uVar11 = iVar13 - 1U & uVar17;
        if (uVar11 < uVar10) {
          iVar5 = iVar19 + -1;
        }
        else {
          uVar17 = uVar17 & uVar9;
          if ((int)uVar17 < iVar13) {
            uVar10 = 0;
          }
          uVar11 = uVar17 - uVar10;
          iVar5 = iVar19;
        }
        iVar1 = uVar11 - 1;
        iVar14 = 1 - uVar11;
        if (0 < (int)uVar11) {
          iVar14 = iVar1;
        }
        iVar21 = iVar21 - iVar14;
        normalizedCounter[uVar12] = (short)iVar1;
        bVar22 = iVar1 != 0;
        for (; iVar21 < iVar13; iVar13 = iVar13 >> 1) {
          iVar19 = iVar19 + -1;
        }
        uVar17 = iVar5 + uVar18;
        bVar4 = puVar8 <= puVar2;
        puVar20 = (uint *)((long)((int)uVar17 >> 3) + (long)puVar8);
        uVar9 = (uint)uVar12;
        uVar10 = uVar9 + 1;
        uVar12 = (ulong)uVar10;
        uVar18 = uVar17 + ((int)puVar8 - (int)puVar15) * 8;
        puVar8 = puVar15;
        if (bVar4 || puVar20 <= puVar15) {
          uVar18 = uVar17 & 7;
          puVar8 = puVar20;
        }
        uVar17 = *puVar8 >> ((byte)uVar18 & 0x1f);
      } while ((1 < iVar21) && (uVar10 <= uVar3));
      sVar6 = 0xffffffffffffffec;
      if ((iVar21 == 1) && ((int)uVar18 < 0x21)) {
        while (uVar10 <= uVar3) {
          normalizedCounter[uVar12] = 0;
          uVar10 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar10;
        }
        *maxSVPtr = uVar9;
        sVar6 = (long)puVar8 + ((long)((int)(uVar18 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) return ERROR(srcSize_wrong);
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}